

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O1

void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *pFxchMan,int iVarNew)

{
  Vec_Wec_t *pVVar1;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  undefined4 in_register_00000034;
  uint uVar16;
  long lVar17;
  Vec_Int_t *p;
  bool bVar18;
  int fCompl;
  int local_94;
  undefined8 local_90;
  Vec_Int_t *local_88;
  Vec_Int_t *local_80;
  long local_78;
  int local_6c;
  int local_68;
  int local_64;
  Vec_Int_t *local_60;
  ulong local_58;
  Vec_Int_t *local_50;
  long local_48;
  Vec_Int_t *local_40;
  long local_38;
  
  local_90 = CONCAT44(in_register_00000034,iVarNew);
  pVVar9 = pFxchMan->vPairs;
  if (1 < pVVar9->nSize) {
    local_68 = iVarNew * 2;
    local_6c = iVarNew * 2 + 1;
    lVar17 = 0;
    do {
      iVar11 = pVVar9->pArray[lVar17];
      lVar13 = (long)iVar11;
      uVar16 = pVVar9->pArray[lVar17 + 1];
      uVar12 = (ulong)uVar16;
      local_94 = 0;
      if (lVar13 < 0) goto LAB_004c288c;
      iVar6 = pFxchMan->vCubes->nSize;
      if (((iVar6 <= iVar11) || (local_38 = lVar17, (int)uVar16 < 0)) || (iVar6 <= (int)uVar16))
      goto LAB_004c288c;
      pVVar9 = pFxchMan->vCubes->pArray;
      p = pVVar9 + lVar13;
      local_78 = lVar13;
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      iVar11 = p->nSize;
      lVar17 = (long)iVar11;
      pVVar7->nSize = iVar11;
      pVVar7->nCap = iVar11;
      if (lVar17 == 0) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = (int *)malloc(lVar17 * 4);
      }
      pVVar9 = pVVar9 + uVar12;
      pVVar7->pArray = piVar8;
      memcpy(piVar8,p->pArray,lVar17 << 2);
      local_50 = (Vec_Int_t *)malloc(0x10);
      iVar11 = pVVar9->nSize;
      lVar17 = (long)iVar11;
      local_50->nSize = iVar11;
      local_50->nCap = iVar11;
      local_58 = uVar12;
      if (lVar17 == 0) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = (int *)malloc(lVar17 * 4);
      }
      pVVar3 = local_50;
      local_50->pArray = piVar8;
      memcpy(piVar8,pVVar9->pArray,lVar17 << 2);
      iVar6 = Fxch_DivRemoveLits(pVVar7,pVVar3,pFxchMan->vDiv,&local_94);
      iVar11 = pFxchMan->vDiv->nSize;
      if (iVar6 != iVar11) {
        __assert_fail("RetValue == Vec_IntSize( pFxchMan->vDiv )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                      ,0x19a,"void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *, const int)");
      }
      pFxchMan->nLits = (pFxchMan->nLits - (iVar11 + pVVar9->nSize)) + 2;
      uVar16 = pFxchMan->nSizeOutputID;
      uVar10 = uVar16 * (int)local_78;
      if ((int)uVar10 < 0) {
LAB_004c28e9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar11 = pFxchMan->vOutputID->nSize;
      if (((iVar11 <= (int)uVar10) ||
          (uVar15 = uVar16 * (int)local_58, local_60 = pVVar9, (int)uVar15 < 0)) ||
         (iVar11 <= (int)uVar15)) goto LAB_004c28e9;
      local_88 = pVVar7;
      if ((int)uVar16 < 1) {
LAB_004c2224:
        p->nSize = 0;
        if (0 < pVVar7->nSize) {
          lVar17 = 0;
          do {
            Vec_IntPush(p,pVVar7->pArray[lVar17]);
            lVar17 = lVar17 + 1;
          } while (lVar17 < pVVar7->nSize);
        }
        Vec_IntPush(pFxchMan->vCubesToUpdate,(int)local_78);
        local_60->nSize = 0;
        pVVar9 = pFxchMan->vDiv;
        if (0 < pVVar9->nSize) {
          local_80 = (Vec_Int_t *)pVVar9->pArray;
          pVVar1 = pFxchMan->vLits;
          lVar17 = 0;
          do {
            if ((&local_80->nCap)[lVar17] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar16 = (uint)(&local_80->nCap)[lVar17] >> 1;
            if (pVVar1->nSize <= (int)uVar16) goto LAB_004c288c;
            pVVar2 = pFxchMan->vCubes;
            pVVar3 = pVVar2->pArray;
            if ((p < pVVar3) || (pVVar3 + pVVar2->nSize <= p)) goto LAB_004c286d;
            pVVar4 = pVVar1->pArray;
            uVar10 = pVVar4[uVar16].nSize;
            uVar12 = 0;
            bVar18 = 0 < (int)uVar10;
            iVar11 = (int)((ulong)((long)p - (long)pVVar3) >> 4);
            if (0 < (int)uVar10) {
              bVar18 = true;
              if (*pVVar4[uVar16].pArray != iVar11) {
                uVar14 = 0;
                do {
                  if ((ulong)uVar10 - 1 == uVar14) {
                    bVar18 = false;
                    uVar12 = (ulong)uVar10;
                    pVVar7 = local_88;
                    goto LAB_004c2333;
                  }
                  uVar12 = uVar14 + 1;
                  lVar13 = uVar14 + 1;
                  uVar14 = uVar12;
                } while (pVVar4[uVar16].pArray[lVar13] != iVar11);
                bVar18 = uVar12 < uVar10;
                pVVar7 = local_88;
              }
            }
LAB_004c2333:
            if ((uint)uVar12 != uVar10) {
              if (!bVar18) goto LAB_004c28ca;
              uVar15 = (uint)uVar12 + 1;
              if ((int)uVar15 < (int)uVar10) {
                piVar5 = pVVar4[uVar16].pArray;
                piVar8 = piVar5 + uVar15;
                do {
                  iVar6 = (int)uVar12;
                  piVar5[uVar12 & 0xffffffff] = *piVar8;
                  uVar10 = pVVar4[uVar16].nSize;
                  piVar8 = piVar8 + 1;
                  uVar12 = (ulong)(iVar6 + 1);
                } while (iVar6 + 2 < (int)uVar10);
              }
              pVVar4[uVar16].nSize = uVar10 - 1;
              pVVar7 = local_88;
            }
            uVar16 = uVar16 ^ 1;
            if (pVVar1->nSize <= (int)uVar16) goto LAB_004c288c;
            if (pVVar3 + pVVar2->nSize <= p) goto LAB_004c286d;
            uVar10 = pVVar4[uVar16].nSize;
            uVar12 = 0;
            bVar18 = 0 < (int)uVar10;
            if (0 < (int)uVar10) {
              bVar18 = true;
              uVar12 = 0;
              if (*pVVar4[uVar16].pArray != iVar11) {
                uVar14 = 0;
                do {
                  if ((ulong)uVar10 - 1 == uVar14) {
                    bVar18 = false;
                    uVar12 = (ulong)uVar10;
                    goto LAB_004c2404;
                  }
                  uVar12 = uVar14 + 1;
                  lVar13 = uVar14 + 1;
                  uVar14 = uVar12;
                } while (pVVar4[uVar16].pArray[lVar13] != iVar11);
                bVar18 = uVar12 < uVar10;
              }
            }
LAB_004c2404:
            if ((uint)uVar12 != uVar10) {
              if (!bVar18) {
LAB_004c28ca:
                __assert_fail("i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
              }
              uVar15 = (uint)uVar12 + 1;
              if ((int)uVar15 < (int)uVar10) {
                piVar5 = pVVar4[uVar16].pArray;
                piVar8 = piVar5 + uVar15;
                do {
                  iVar11 = (int)uVar12;
                  piVar5[uVar12 & 0xffffffff] = *piVar8;
                  uVar10 = pVVar4[uVar16].nSize;
                  piVar8 = piVar8 + 1;
                  uVar12 = (ulong)(iVar11 + 1);
                } while (iVar11 + 2 < (int)uVar10);
              }
              pVVar4[uVar16].nSize = uVar10 - 1;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < pVVar9->nSize);
        }
      }
      else {
        piVar8 = pFxchMan->vOutputID->pArray;
        uVar12 = 1;
        do {
          lVar17 = uVar12 - 1;
          lVar13 = uVar12 - 1;
          if (uVar16 <= uVar12) break;
          uVar12 = uVar12 + 1;
        } while (piVar8[(ulong)uVar10 + lVar17] == piVar8[(ulong)uVar15 + lVar13]);
        if (piVar8[(ulong)uVar10 + lVar17] == piVar8[(ulong)uVar15 + lVar13]) goto LAB_004c2224;
        if (0 < pFxchMan->nSizeOutputID) {
          piVar5 = pFxchMan->pTempOutputID;
          lVar17 = 0;
          do {
            piVar5[lVar17] = piVar8[(ulong)uVar15 + lVar17] & piVar8[(ulong)uVar10 + lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 < pFxchMan->nSizeOutputID);
        }
        local_40 = p;
        pVVar9 = Vec_WecPushLevel(pFxchMan->vCubes);
        if (0 < pVVar7->nSize) {
          lVar17 = 0;
          do {
            Vec_IntPush(pVVar9,pVVar7->pArray[lVar17]);
            lVar17 = lVar17 + 1;
          } while (lVar17 < pVVar7->nSize);
        }
        iVar11 = pFxchMan->nSizeOutputID;
        local_80 = pVVar9;
        if (0 < (long)iVar11) {
          pVVar9 = pFxchMan->vOutputID;
          piVar5 = pFxchMan->pTempOutputID;
          lVar17 = 0;
          do {
            Vec_IntPush(pVVar9,piVar5[lVar17]);
            lVar17 = lVar17 + 1;
          } while (iVar11 != lVar17);
        }
        p = local_80;
        pVVar9 = pFxchMan->vCubes->pArray;
        if ((local_80 < pVVar9) || (pVVar9 + pFxchMan->vCubes->nSize <= local_80))
        goto LAB_004c286d;
        Vec_IntPush(pFxchMan->vCubesToUpdate,(int)((ulong)((long)local_80 - (long)pVVar9) >> 4));
        if (1 < p->nSize) {
          lVar17 = 1;
          do {
            pVVar9 = pFxchMan->vCubes->pArray;
            if ((p < pVVar9) || (pVVar9 + pFxchMan->vCubes->nSize <= p)) goto LAB_004c286d;
            uVar16 = p->pArray[lVar17];
            pVVar1 = pFxchMan->vLits;
            if (pVVar1->nSize <= (int)uVar16) {
              iVar11 = uVar16 + 1;
              iVar6 = pVVar1->nSize * 2;
              if (iVar6 <= iVar11) {
                iVar6 = iVar11;
              }
              if (pVVar1->nCap < iVar6) {
                local_48 = (long)iVar6;
                local_64 = iVar11;
                if (pVVar1->pArray == (Vec_Int_t *)0x0) {
                  pVVar7 = (Vec_Int_t *)malloc(local_48 << 4);
                }
                else {
                  pVVar7 = (Vec_Int_t *)realloc(pVVar1->pArray,local_48 << 4);
                }
                pVVar1->pArray = pVVar7;
                memset(pVVar7 + pVVar1->nCap,0,(local_48 - pVVar1->nCap) * 0x10);
                pVVar1->nCap = (int)local_48;
                iVar11 = local_64;
              }
              pVVar1->nSize = iVar11;
            }
            p = local_80;
            if (((int)uVar16 < 0) || (pVVar1->nSize <= (int)uVar16)) goto LAB_004c288c;
            Vec_IntPush(pVVar1->pArray + uVar16,(int)((ulong)((long)local_80 - (long)pVVar9) >> 4));
            lVar17 = lVar17 + 1;
          } while (lVar17 < p->nSize);
        }
        pVVar7 = local_88;
        if (pFxchMan->nSizeOutputID < 1) {
LAB_004c268e:
          local_40->nSize = 0;
        }
        else {
          piVar5 = pFxchMan->pTempOutputID;
          lVar17 = 0;
          uVar16 = 0;
          do {
            piVar5[lVar17] = piVar8[(ulong)uVar10 + lVar17];
            uVar16 = uVar16 | ~piVar8[(ulong)uVar15 + lVar17] & piVar8[(ulong)uVar10 + lVar17];
            piVar8[(ulong)uVar10 + lVar17] =
                 ~piVar8[(ulong)uVar15 + lVar17] & piVar8[(ulong)uVar10 + lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 < pFxchMan->nSizeOutputID);
          if (uVar16 == 0) goto LAB_004c268e;
          Vec_IntPush(pFxchMan->vCubesToUpdate,(int)local_78);
        }
        if (pFxchMan->nSizeOutputID < 1) {
LAB_004c26d9:
          local_60->nSize = 0;
        }
        else {
          piVar5 = pFxchMan->pTempOutputID;
          lVar17 = 0;
          uVar16 = 0;
          do {
            uVar10 = ~piVar5[lVar17] & piVar8[(ulong)uVar15 + lVar17];
            uVar16 = uVar16 | uVar10;
            piVar8[(ulong)uVar15 + lVar17] = uVar10;
            lVar17 = lVar17 + 1;
          } while (lVar17 < pFxchMan->nSizeOutputID);
          if (uVar16 == 0) goto LAB_004c26d9;
          Vec_IntPush(pFxchMan->vCubesToUpdate,(int)local_58);
        }
      }
      if (pVVar7->pArray != (int *)0x0) {
        free(pVVar7->pArray);
        pVVar7->pArray = (int *)0x0;
      }
      free(pVVar7);
      pVVar9 = local_50;
      if (local_50->pArray != (int *)0x0) {
        free(local_50->pArray);
        pVVar9->pArray = (int *)0x0;
      }
      free(pVVar9);
      if ((int)local_90 != 0) {
        lVar17 = (long)pFxchMan->vLits->nSize;
        if (lVar17 < 2) {
LAB_004c288c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if (p == (Vec_Int_t *)0x0) {
          __assert_fail("vCube",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                        ,0x1ed,"void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *, const int)");
        }
        pVVar9 = pFxchMan->vLits->pArray;
        if ((pFxchMan->vDiv->nSize == 2) || (local_94 != 0)) {
          if ((int)local_90 < 0) goto LAB_004c2946;
          Vec_IntPush(p,local_6c);
          pVVar7 = pFxchMan->vCubes->pArray;
          if ((p < pVVar7) || (pVVar7 + pFxchMan->vCubes->nSize <= p)) goto LAB_004c286d;
          Vec_IntPush(pVVar9 + lVar17 + -1,(int)((ulong)((long)p - (long)pVVar7) >> 4));
          lVar13 = lVar17 + -1;
          lVar17 = lVar17 + -1;
        }
        else {
          if ((int)local_90 < 0) {
LAB_004c2946:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush(p,local_68);
          pVVar7 = pFxchMan->vCubes->pArray;
          if ((p < pVVar7) || (pVVar7 + pFxchMan->vCubes->nSize <= p)) {
LAB_004c286d:
            __assert_fail("p->pArray <= vLevel && vLevel < p->pArray + p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0xba,"int Vec_WecLevelId(Vec_Wec_t *, Vec_Int_t *)");
          }
          Vec_IntPush(pVVar9 + lVar17 + -2,(int)((ulong)((long)p - (long)pVVar7) >> 4));
          lVar13 = lVar17 + -2;
          lVar17 = lVar17 + -2;
        }
        qsort(pVVar9[lVar13].pArray,(long)pVVar9[lVar17].nSize,4,Vec_IntSortCompare1);
      }
      lVar17 = local_38 + 2;
      pVVar9 = pFxchMan->vPairs;
    } while ((int)((uint)lVar17 | 1) < pVVar9->nSize);
  }
  return;
}

Assistant:

static inline void Fxch_ManExtractDivFromCubePairs( Fxch_Man_t* pFxchMan,
                                                   const int iVarNew )
{
    /* For each pair (Ci, Cj) */
    int iCube0, iCube1, i;


    Vec_IntForEachEntryDouble( pFxchMan->vPairs, iCube0, iCube1, i )
    {
        int j, Lit,
            RetValue,
            fCompl = 0;
        int * pOutputID0, * pOutputID1;

        Vec_Int_t* vCube = NULL,
                 * vCube0 = Fxch_ManGetCube( pFxchMan, iCube0 ),
                 * vCube1 = Fxch_ManGetCube( pFxchMan, iCube1 ),
                 * vCube0Copy = Vec_IntDup( vCube0 ),
                 * vCube1Copy = Vec_IntDup( vCube1 );

        RetValue  = Fxch_DivRemoveLits( vCube0Copy, vCube1Copy, pFxchMan->vDiv, &fCompl );

        assert( RetValue == Vec_IntSize( pFxchMan->vDiv ) );

        pFxchMan->nLits -= Vec_IntSize( pFxchMan->vDiv ) + Vec_IntSize( vCube1 ) - 2;

        /* Identify type of Extraction */
        pOutputID0 = Vec_IntEntryP( pFxchMan->vOutputID, iCube0 * pFxchMan->nSizeOutputID );
        pOutputID1 = Vec_IntEntryP( pFxchMan->vOutputID, iCube1 * pFxchMan->nSizeOutputID );
        RetValue = 1;
        for ( j = 0; j < pFxchMan->nSizeOutputID && RetValue; j++ )
            RetValue = ( pOutputID0[j] == pOutputID1[j] );

        /* Exact Extractraion */
        if ( RetValue )
        {
            Vec_IntClear( vCube0 );
            Vec_IntAppend( vCube0, vCube0Copy );
            vCube = vCube0;

            Vec_IntPush( pFxchMan->vCubesToUpdate, iCube0 );
            Vec_IntClear( vCube1 );

            /* Update Lit -> Cube mapping */
            Vec_IntForEachEntry( pFxchMan->vDiv, Lit, j )
            {
                Vec_IntRemove( Vec_WecEntry( pFxchMan->vLits, Abc_Lit2Var( Lit ) ),
                               Vec_WecLevelId( pFxchMan->vCubes, vCube0 ) );
                Vec_IntRemove( Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Abc_Lit2Var( Lit ) ) ),
                               Vec_WecLevelId( pFxchMan->vCubes, vCube0 ) );
            }

        }
        /* Unexact Extraction */
        else
        {
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                pFxchMan->pTempOutputID[j] = ( pOutputID0[j] & pOutputID1[j] );

            /* Create new cube */
            vCube = Vec_WecPushLevel( pFxchMan->vCubes );
            Vec_IntAppend( vCube, vCube0Copy );
            Vec_IntPushArray( pFxchMan->vOutputID, pFxchMan->pTempOutputID, pFxchMan->nSizeOutputID );
            Vec_IntPush( pFxchMan->vCubesToUpdate, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );

            /* Update Lit -> Cube mapping */
            Vec_IntForEachEntryStart( vCube, Lit, j, 1 )
                Vec_WecPush( pFxchMan->vLits, Lit, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );

            /*********************************************************/
            RetValue = 0;
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            {
                pFxchMan->pTempOutputID[j] = pOutputID0[j];
                RetValue |= ( pOutputID0[j] & ~( pOutputID1[j] ) );
                pOutputID0[j] &= ~( pOutputID1[j] );
            }

            if ( RetValue != 0 )
                Vec_IntPush( pFxchMan->vCubesToUpdate, iCube0 );
            else
                Vec_IntClear( vCube0 );

            /*********************************************************/
            RetValue = 0;
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            {
                RetValue |= ( pOutputID1[j] & ~( pFxchMan->pTempOutputID[j] ) );
                pOutputID1[j] &= ~( pFxchMan->pTempOutputID[j] );
            }

            if ( RetValue != 0 )
                Vec_IntPush( pFxchMan->vCubesToUpdate, iCube1 );
            else
                Vec_IntClear( vCube1 );

        }
        Vec_IntFree( vCube0Copy );
        Vec_IntFree( vCube1Copy );

        if ( iVarNew )
        {
            Vec_Int_t* vLitP = Vec_WecEntry( pFxchMan->vLits, Vec_WecSize( pFxchMan->vLits ) - 2 ),
                     * vLitN = Vec_WecEntry( pFxchMan->vLits, Vec_WecSize( pFxchMan->vLits ) - 1 );

            assert( vCube );
            if ( Vec_IntSize( pFxchMan->vDiv ) == 2 || fCompl )
            {
                Vec_IntPush( vCube, Abc_Var2Lit( iVarNew, 1 ) );
                Vec_IntPush( vLitN, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );
                Vec_IntSort( vLitN, 0 );
            }
            else
            {
                Vec_IntPush( vCube, Abc_Var2Lit( iVarNew, 0 ) );
                Vec_IntPush( vLitP, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );
                Vec_IntSort( vLitP, 0 );
            }
        }
    }

    return;
}